

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrOpaque(string *tempdir)

{
  exr_context_t f;
  exr_context_t local_10;
  
  local_10 = createDummyFile("<opaque>");
  testOpaqueHelper(local_10);
  exr_print_context_info(local_10,0);
  exr_print_context_info(local_10,1);
  exr_finish(&local_10);
  return;
}

Assistant:

void
testAttrOpaque (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testOpaqueHelper (NULL);
    exr_context_t f = createDummyFile ("<opaque>");
    testOpaqueHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}